

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O2

int __thiscall pbrt::PixelFilter::writeTo(PixelFilter *this,BinaryWriter *binary)

{
  int filterType;
  
  BinaryWriter::write<int>(binary,&filterType);
  BinaryWriter::write<float>(binary,&this->radius);
  BinaryWriter::write<float>(binary,&this->alpha);
  return 0x50;
}

Assistant:

int PixelFilter::writeTo(BinaryWriter &binary)  {
    int filterType = static_cast<int>(type);
    binary.write(filterType);
    binary.write(radius);
    binary.write(alpha);
    return TYPE_PIXEL_FILTER;
}